

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_draw_list_fill_circle(nk_draw_list *list,nk_vec2 center,float radius,nk_color col,uint segs)

{
  uint in_EDX;
  undefined4 in_ESI;
  long in_RDI;
  float fVar1;
  nk_color in_XMM1_Da;
  float a_max;
  undefined4 in_stack_00000018;
  undefined4 in_stack_ffffffffffffffd8;
  char cStack_9;
  
  if ((in_RDI != 0) && (cStack_9 = (char)((uint)in_ESI >> 0x18), cStack_9 != '\0')) {
    fVar1 = (((float)in_EDX + -1.0) * 6.2831855) / (float)in_EDX;
    nk_draw_list_path_arc_to
              ((nk_draw_list *)CONCAT44(col,in_stack_00000018),center,list._4_4_,list._0_4_,radius,
               segs);
    nk_draw_list_path_fill((nk_draw_list *)CONCAT44(fVar1,in_stack_ffffffffffffffd8),in_XMM1_Da);
  }
  return;
}

Assistant:

NK_API void
nk_draw_list_fill_circle(struct nk_draw_list *list, struct nk_vec2 center,
float radius, struct nk_color col, unsigned int segs)
{
float a_max;
NK_ASSERT(list);
if (!list || !col.a) return;
a_max = NK_PI * 2.0f * ((float)segs - 1.0f) / (float)segs;
nk_draw_list_path_arc_to(list, center, radius, 0.0f, a_max, segs);
nk_draw_list_path_fill(list, col);
}